

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

bool __thiscall
QSqlTableModel::removeRows(QSqlTableModel *this,int row,int count,QModelIndex *parent)

{
  Op OVar1;
  long lVar2;
  QSqlRecord QVar3;
  undefined1 uVar4;
  int iVar5;
  ModifiedRow *pMVar6;
  QSqlRecord *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QSqlRecord moved;
  QSqlQueryModel local_c0;
  QSqlRecord local_b0;
  int local_a4;
  QSqlRecord local_a0;
  Op local_98;
  QSqlRecord local_90;
  QSqlRecord local_88;
  ushort local_80;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = false;
  if ((-1 < parent->r) && (-1 < parent->c)) {
    bVar8 = (parent->m).ptr != (QAbstractItemModel *)0x0;
  }
  local_a4 = row;
  if (((0 < count) && (-1 < row)) && (!bVar8)) {
    lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    local_58.m_op = ~None;
    local_58._4_4_ = 0xffffffff;
    local_58.m_rec.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    local_58.m_db_values.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    iVar5 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))(this);
    if (row + count <= iVar5) {
      if (*(int *)(lVar2 + 0x238) != 2) {
        bVar8 = true;
        if (count < 2) {
          QSqlRecord::QSqlRecord(&local_b0);
          pQVar7 = &local_78.m_rec;
          local_78.m_op = None;
          QSqlRecord::QSqlRecord(pQVar7);
          QSqlRecord::QSqlRecord(&local_78.m_db_values,&local_b0);
          local_78.m_submitted = true;
          local_78.m_insert = false;
          if (local_78.m_op != None) {
            local_78.m_submitted = true;
            local_78.m_insert = false;
            local_78.m_op = None;
            QSqlRecord::operator=(pQVar7,&local_78.m_db_values);
            OVar1 = local_78.m_op;
            iVar5 = QSqlRecord::count(pQVar7);
            if (0 < iVar5) {
              iVar5 = iVar5 + 1;
              do {
                QSqlRecord::setGenerated(pQVar7,iVar5 + -2,OVar1 == Delete);
                iVar5 = iVar5 + -1;
              } while (1 < iVar5);
            }
          }
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                    (&local_58,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                     &local_a4,&local_78);
          if (local_58.m_submitted == true) {
            bVar8 = isDirty(this);
          }
          else {
            bVar8 = false;
          }
        }
        if (count < 2) {
          QSqlRecord::~QSqlRecord(&local_58.m_db_values);
          QSqlRecord::~QSqlRecord(&local_58.m_rec);
          QSqlRecord::~QSqlRecord(&local_78.m_db_values);
          QSqlRecord::~QSqlRecord(&local_78.m_rec);
          QSqlRecord::~QSqlRecord(&local_b0);
        }
        if (bVar8 != false) goto LAB_0013ca13;
      }
      local_c0._12_4_ = local_a4 + count + -1;
      if (0 < count) {
        do {
          pMVar6 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                             ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                              (int *)&local_c0.field_0xc);
          OVar1 = pMVar6->m_op;
          if (OVar1 == None) {
            QSqlQueryModel::record(&local_c0,(Orientation)this);
            local_98 = None;
            QSqlRecord::QSqlRecord(&local_90);
            QSqlRecord::QSqlRecord(&local_88,(QSqlRecord *)&local_c0);
            local_80 = local_80 & 0xff;
            if (local_98 != Delete) {
              local_80 = 0;
              local_98 = Delete;
              QSqlRecord::operator=(&local_90,&local_88);
              OVar1 = local_98;
              iVar5 = QSqlRecord::count(&local_90);
              if (0 < iVar5) {
                iVar5 = iVar5 + 1;
                do {
                  QSqlRecord::setGenerated(&local_90,iVar5 + -2,OVar1 == Delete);
                  iVar5 = iVar5 + -1;
                } while (1 < iVar5);
              }
            }
            QVar3.d.d.ptr = local_90.d.d.ptr;
            pMVar6->m_op = local_98;
            local_90.d.d.ptr =
                 (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
                 (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
            local_a0.d.d.ptr =
                 (QExplicitlySharedDataPointer<QSqlRecordPrivate>)(pMVar6->m_rec).d.d.ptr;
            (pMVar6->m_rec).d.d.ptr = (QSqlRecordPrivate *)QVar3.d.d.ptr;
            QSqlRecord::~QSqlRecord(&local_a0);
            QVar3.d.d.ptr = local_88.d.d.ptr;
            local_88.d.d.ptr =
                 (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
                 (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
            local_a0.d.d.ptr =
                 (QExplicitlySharedDataPointer<QSqlRecordPrivate>)(pMVar6->m_db_values).d.d.ptr;
            (pMVar6->m_db_values).d.d.ptr = (QSqlRecordPrivate *)QVar3.d.d.ptr;
            QSqlRecord::~QSqlRecord(&local_a0);
            pMVar6->m_submitted = (bool)(undefined1)local_80;
            pMVar6->m_insert = (bool)local_80._1_1_;
            QSqlRecord::~QSqlRecord(&local_88);
            QSqlRecord::~QSqlRecord(&local_90);
            QSqlRecord::~QSqlRecord((QSqlRecord *)&local_c0);
LAB_0013cd1f:
            if (*(int *)(lVar2 + 0x238) == 2) {
              QAbstractItemModel::headerDataChanged((Orientation)this,2,local_c0._12_4_);
            }
          }
          else {
            if (OVar1 == Delete) goto LAB_0013cd1f;
            if (OVar1 != Insert) {
              pMVar6->m_submitted = false;
              pMVar6->m_op = Delete;
              pQVar7 = &pMVar6->m_rec;
              QSqlRecord::operator=(pQVar7,&pMVar6->m_db_values);
              OVar1 = pMVar6->m_op;
              iVar5 = QSqlRecord::count(pQVar7);
              if (0 < iVar5) {
                iVar5 = iVar5 + 1;
                do {
                  QSqlRecord::setGenerated(pQVar7,iVar5 + -2,OVar1 == Delete);
                  iVar5 = iVar5 + -1;
                } while (1 < iVar5);
              }
              goto LAB_0013cd1f;
            }
            (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1c0))(this,local_c0._12_4_);
          }
          iVar5 = local_c0._12_4_ + -1;
          bVar8 = local_a4 < (int)local_c0._12_4_;
          local_c0._12_4_ = iVar5;
        } while (bVar8);
      }
      uVar4 = 1;
      if (*(int *)(lVar2 + 0x238) != 2) {
        uVar4 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x170))(this);
      }
      goto LAB_0013ca15;
    }
  }
LAB_0013ca13:
  uVar4 = 0;
LAB_0013ca15:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::removeRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSqlTableModel);
    if (parent.isValid() || row < 0 || count <= 0 || row + count > rowCount())
        return false;

    if (d->strategy != OnManualSubmit)
        if (count > 1 || (d->cache.value(row).submitted() && isDirty()))
            return false;

    // Iterate backwards so we don't have to worry about removed rows causing
    // higher cache entries to shift downwards.
    for (int idx = row + count - 1; idx >= row; --idx) {
        QSqlTableModelPrivate::ModifiedRow& mrow = d->cache[idx];
        if (mrow.op() == QSqlTableModelPrivate::Insert) {
            revertRow(idx);
        } else {
            if (mrow.op() == QSqlTableModelPrivate::None)
                mrow = QSqlTableModelPrivate::ModifiedRow(QSqlTableModelPrivate::Delete,
                                                          QSqlQueryModel::record(idx));
            else
                mrow.setOp(QSqlTableModelPrivate::Delete);
            if (d->strategy == OnManualSubmit)
                emit headerDataChanged(Qt::Vertical, idx, idx);
        }
    }

    if (d->strategy != OnManualSubmit)
        return submit();

    return true;
}